

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O2

Response dispatch_command(Command *cmd,Task *task,DatabaseSnapshot *snap)

{
  char cVar1;
  json_value extraout_RDX;
  Response RVar2;
  undefined8 local_18;
  
  cVar1 = *(char *)&task[5].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>._M_impl
                    .super__Vector_impl_data._M_finish;
  local_18 = snap;
  if (cVar1 == -1) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    cVar1 = *(char *)&task[5].changes_.super__Vector_base<DBChange,_std::allocator<DBChange>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
  }
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<Response>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Daemon.cpp:221:9)_&&,_const_std::variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>_&>
    ::_S_vtable._M_arr[cVar1]._M_data)
            ((anon_class_16_2_3fdaa394 *)cmd,
             (variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)&stack0xffffffffffffffe0);
  RVar2.content.m_value.object = extraout_RDX.object;
  RVar2.content._0_8_ = cmd;
  return (Response)RVar2.content;
}

Assistant:

Response dispatch_command(const Command &cmd, Task *task,
                          const DatabaseSnapshot *snap) {
    return std::visit(
        [snap, task](const auto &cmd) {
            return execute_command(cmd, task, snap);
        },
        cmd);
}